

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeOverwriteCell(BtCursor *pCur,BtreePayload *pX)

{
  ushort uVar1;
  MemPage *pMVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint iOffset;
  u8 *puVar6;
  MemPage *pPage;
  Pgno local_44;
  MemPage *local_40;
  BtShared *local_38;
  
  uVar5 = pX->nZero + pX->nData;
  pMVar2 = pCur->pPage;
  puVar6 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  local_40 = pMVar2;
  if ((pMVar2->aDataEnd < puVar6 + uVar1) || (puVar6 < pMVar2->aData + pMVar2->cellOffset)) {
    iVar3 = sqlite3CorruptError(0x1280d);
    return iVar3;
  }
  iVar3 = btreeOverwriteContent(pMVar2,puVar6,pX,0,(uint)uVar1);
  if (iVar3 == 0) {
    uVar1 = (pCur->info).nLocal;
    iOffset = (uint)uVar1;
    iVar3 = 0;
    if (uVar5 != uVar1) {
      local_44 = sqlite3Get4byte((pCur->info).pPayload + (uint)uVar1);
      local_38 = pMVar2->pBt;
      iVar3 = local_38->usableSize - 4;
      do {
        iVar4 = btreeGetPage(local_38,local_44,&local_40,0);
        pMVar2 = local_40;
        if (iVar4 != 0) {
          return iVar4;
        }
        if ((local_40->pDbPage->nRef == 1) && (local_40->isInit == '\0')) {
          if (iVar3 + iOffset < uVar5) {
            puVar6 = local_40->aData;
            local_44 = sqlite3Get4byte(puVar6);
          }
          else {
            iVar3 = uVar5 - iOffset;
            puVar6 = local_40->aData;
          }
          iVar4 = btreeOverwriteContent(pMVar2,puVar6 + 4,pX,iOffset,iVar3);
        }
        else {
          iVar4 = sqlite3CorruptError(0x12820);
        }
        sqlite3PagerUnref(pMVar2->pDbPage);
        if (iVar4 != 0) {
          return iVar4;
        }
        iOffset = iOffset + iVar3;
      } while ((int)iOffset < (int)uVar5);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int btreeOverwriteCell(BtCursor *pCur, const BtreePayload *pX){
  int iOffset;                        /* Next byte of pX->pData to write */
  int nTotal = pX->nData + pX->nZero; /* Total bytes of to write */
  int rc;                             /* Return code */
  MemPage *pPage = pCur->pPage;       /* Page being written */
  BtShared *pBt;                      /* Btree */
  Pgno ovflPgno;                      /* Next overflow page to write */
  u32 ovflPageSize;                   /* Size to write on overflow page */

  if( pCur->info.pPayload + pCur->info.nLocal > pPage->aDataEnd
   || pCur->info.pPayload < pPage->aData + pPage->cellOffset
  ){
    return SQLITE_CORRUPT_BKPT;
  }
  /* Overwrite the local portion first */
  rc = btreeOverwriteContent(pPage, pCur->info.pPayload, pX,
                             0, pCur->info.nLocal);
  if( rc ) return rc;
  if( pCur->info.nLocal==nTotal ) return SQLITE_OK;

  /* Now overwrite the overflow pages */
  iOffset = pCur->info.nLocal;
  assert( nTotal>=0 );
  assert( iOffset>=0 );
  ovflPgno = get4byte(pCur->info.pPayload + iOffset);
  pBt = pPage->pBt;
  ovflPageSize = pBt->usableSize - 4;
  do{
    rc = btreeGetPage(pBt, ovflPgno, &pPage, 0);
    if( rc ) return rc;
    if( sqlite3PagerPageRefcount(pPage->pDbPage)!=1 || pPage->isInit ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      if( iOffset+ovflPageSize<(u32)nTotal ){
        ovflPgno = get4byte(pPage->aData);
      }else{
        ovflPageSize = nTotal - iOffset;
      }
      rc = btreeOverwriteContent(pPage, pPage->aData+4, pX,
                                 iOffset, ovflPageSize);
    }
    sqlite3PagerUnref(pPage->pDbPage);
    if( rc ) return rc;
    iOffset += ovflPageSize;
  }while( iOffset<nTotal );
  return SQLITE_OK;
}